

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextengine.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1619e0d::Itemizer::generate
          (Itemizer *this,int start,int length,Capitalization caps)

{
  QScriptAnalysis *pQVar1;
  QScriptAnalysis QVar2;
  QScriptAnalysis QVar3;
  bool bVar4;
  undefined8 __p;
  long lVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  iterator iVar10;
  ulong uVar11;
  QScriptAnalysis *pQVar12;
  char cVar13;
  QTextBoundaryFinder *pQVar14;
  ulong uVar15;
  ulong uVar16;
  char16_t *pcVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  QScriptItem local_80;
  undefined4 local_5c;
  int local_58 [2];
  void *local_50;
  char16_t *local_48;
  undefined4 local_3c;
  long local_38;
  
  uVar11 = (ulong)(uint)start;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (caps == MixedCase) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      generateScriptItems(this,start,length);
      return;
    }
  }
  else {
    if (caps == Capitalize) {
      if (length != 0) {
        pQVar14 = (this->m_splitter)._M_t.
                  super___uniq_ptr_impl<QTextBoundaryFinder,_std::default_delete<QTextBoundaryFinder>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_QTextBoundaryFinder_*,_std::default_delete<QTextBoundaryFinder>_>
                  .super__Head_base<0UL,_QTextBoundaryFinder_*,_false>._M_head_impl;
        if (pQVar14 == (QTextBoundaryFinder *)0x0) {
          local_3c = 1;
          local_48 = (this->m_string->d).ptr;
          if (local_48 == (char16_t *)0x0) {
            local_48 = (char16_t *)&QString::_empty;
          }
          local_50 = (void *)(this->m_string->d).size;
          local_58[0] = 0;
          local_58[1] = 0;
          local_5c = 0;
          std::
          make_unique<QTextBoundaryFinder,QTextBoundaryFinder::BoundaryType,QChar_const*,long_long,decltype(nullptr),int>
                    ((BoundaryType *)&local_80,(QChar **)&local_3c,(longlong *)&local_48,&local_50,
                     local_58);
          __p = local_80._0_8_;
          local_80._0_8_ =
               (__uniq_ptr_impl<QTextBoundaryFinder,_std::default_delete<QTextBoundaryFinder>_>)0x0;
          std::__uniq_ptr_impl<QTextBoundaryFinder,_std::default_delete<QTextBoundaryFinder>_>::
          reset((__uniq_ptr_impl<QTextBoundaryFinder,_std::default_delete<QTextBoundaryFinder>_> *)
                &this->m_splitter,(pointer)__p);
          std::unique_ptr<QTextBoundaryFinder,_std::default_delete<QTextBoundaryFinder>_>::
          ~unique_ptr((unique_ptr<QTextBoundaryFinder,_std::default_delete<QTextBoundaryFinder>_> *)
                      &local_80);
          pQVar14 = (this->m_splitter)._M_t.
                    super___uniq_ptr_impl<QTextBoundaryFinder,_std::default_delete<QTextBoundaryFinder>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_QTextBoundaryFinder_*,_std::default_delete<QTextBoundaryFinder>_>
                    .super__Head_base<0UL,_QTextBoundaryFinder_*,_false>._M_head_impl;
        }
        uVar16 = (ulong)start;
        QTextBoundaryFinder::setPosition((longlong)pQVar14);
        QVar2 = this->m_analysis[uVar16];
        uVar15 = QTextBoundaryFinder::boundaryReasons();
        QVar3 = (QScriptAnalysis)((uint)QVar2 & 0xfffff0ff | 0x200);
        if ((uVar15 & 0x20) == 0) {
          QVar3 = QVar2;
        }
        QTextBoundaryFinder::toNextBoundary();
        do {
          iVar6 = (int)uVar11;
          do {
            uVar16 = uVar16 + 1;
            if ((long)(length + start) <= (long)uVar16) {
              local_80._0_8_ = CONCAT44(QVar3,iVar6);
              local_80.num_glyphs = 0;
              local_80.descent.val = -0x40;
              local_80.ascent.val = -0x40;
              local_80.leading.val = -0x40;
              local_80.width.val = -0x40;
              local_80.glyph_data_offset = 0;
              QList<QScriptItem>::emplaceBack<QScriptItem>(this->m_items,&local_80);
              goto LAB_00484fef;
            }
            uVar11 = QTextBoundaryFinder::position();
            if (uVar16 == uVar11) {
              uVar8 = QTextBoundaryFinder::boundaryReasons();
              cVar13 = (char)((uVar8 & 0x20) >> 5);
              QTextBoundaryFinder::toNextBoundary();
            }
            else {
              cVar13 = '\0';
            }
          } while ((((((uint)this->m_analysis[uVar16] ^ (uint)QVar3) & 0xff0fff) == 0) &&
                   (((uint)this->m_analysis[uVar16] & 0xf00) < 0x700 && cVar13 == '\0')) &&
                  ((int)uVar16 - iVar6 < 0x1000));
          local_80.analysis = QVar3;
          local_80.position = iVar6;
          local_80.num_glyphs = 0;
          local_80.descent.val = -0x40;
          local_80.ascent.val = -0x40;
          local_80.leading.val = -0x40;
          local_80.width.val = -0x40;
          local_80.glyph_data_offset = 0;
          QList<QScriptItem>::emplaceBack<QScriptItem>(this->m_items,&local_80);
          QVar3 = (QScriptAnalysis)((uint)this->m_analysis[uVar16] & 0xfffff0ff | 0x200);
          if (cVar13 == '\0') {
            QVar3 = this->m_analysis[uVar16];
          }
          uVar11 = uVar16 & 0xffffffff;
        } while( true );
      }
    }
    else if (caps == SmallCaps) {
      pcVar17 = (this->m_string->d).ptr;
      if (pcVar17 == (char16_t *)0x0) {
        pcVar17 = (char16_t *)&QString::_empty;
      }
      if (length != 0) {
        iVar6 = QChar::category((uint)(ushort)pcVar17[start]);
        uVar16 = (long)start;
        uVar15 = uVar11;
        do {
          bVar4 = iVar6 == 0xf;
          pQVar12 = this->m_analysis;
          iVar7 = (int)uVar11;
          lVar5 = 0;
          do {
            lVar9 = lVar5;
            uVar18 = uVar16 + lVar9 + 1;
            if ((long)(length + start) <= (long)uVar18) {
              local_80._0_8_ = CONCAT44(this->m_analysis[iVar7],iVar7);
              local_80.num_glyphs = 0;
              local_80.descent.val = -0x40;
              local_80.ascent.val = -0x40;
              local_80.leading.val = -0x40;
              local_80.width.val = -0x40;
              local_80.glyph_data_offset = 0;
              QList<QScriptItem>::emplaceBack<QScriptItem>(this->m_items,&local_80);
              if (bVar4) {
                iVar10 = QList<QScriptItem>::end(this->m_items);
                iVar10.i[-1].analysis =
                     (QScriptAnalysis)((uint)iVar10.i[-1].analysis & 0xfffff0ff | 0x300);
              }
              goto LAB_00484fef;
            }
            iVar6 = QChar::category((uint)(ushort)pcVar17[uVar16 + lVar9 + 1]);
            QVar2 = pQVar12[uVar16 + lVar9 + 1];
            QVar3 = pQVar12[iVar7];
          } while ((((((uint)QVar3 ^ (uint)QVar2) & 0xff0fff) == 0) &&
                   (((uint)QVar2 & 0xf00) < 0x700)) &&
                  (((iVar6 == 0xf) == bVar4 &&
                   (lVar5 = lVar9 + 1, ((int)uVar15 - iVar7) + 1 + (int)lVar9 < 0x1000))));
          local_80.analysis = QVar3;
          local_80.position = iVar7;
          local_80.num_glyphs = 0;
          local_80.descent.val = -0x40;
          local_80.ascent.val = -0x40;
          local_80.leading.val = -0x40;
          local_80.width.val = -0x40;
          local_80.glyph_data_offset = 0;
          QList<QScriptItem>::emplaceBack<QScriptItem>(this->m_items,&local_80);
          if (bVar4) {
            iVar10 = QList<QScriptItem>::end(this->m_items);
            iVar10.i[-1].analysis =
                 (QScriptAnalysis)((uint)iVar10.i[-1].analysis & 0xfffff0ff | 0x300);
          }
          uVar15 = (ulong)((int)uVar15 + 1) + lVar9;
          uVar11 = uVar18 & 0xffffffff;
          uVar16 = uVar18;
        } while( true );
      }
    }
    else {
      generateScriptItems(this,start,length);
      if ((this->m_items->d).size != 0) {
        iVar10 = QList<QScriptItem>::end(this->m_items);
        pQVar12 = &iVar10.i[-1].analysis;
        do {
          if (((uint)*pQVar12 & 0xc00) == 0) {
            *pQVar12 = (QScriptAnalysis)
                       ((uint)*pQVar12 & 0xfffff0ff | (uint)(caps != AllLowercase) * 0x100 + 0x100);
          }
          pQVar1 = pQVar12 + -1;
          pQVar12 = pQVar12 + -8;
        } while (start < (int)*pQVar1);
      }
    }
LAB_00484fef:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void generate(int start, int length, QFont::Capitalization caps)
    {
        if (caps == QFont::SmallCaps)
            generateScriptItemsSmallCaps(reinterpret_cast<const ushort *>(m_string.unicode()), start, length);
        else if (caps == QFont::Capitalize)
            generateScriptItemsCapitalize(start, length);
        else if (caps != QFont::MixedCase) {
            generateScriptItemsAndChangeCase(start, length,
                caps == QFont::AllLowercase ? QScriptAnalysis::Lowercase : QScriptAnalysis::Uppercase);
        }
        else
            generateScriptItems(start, length);
    }